

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.cc
# Opt level: O3

string * __thiscall
tinyusdz::crate::GetCrateDataTypeRepr_abi_cxx11_
          (string *__return_storage_ptr__,crate *this,CrateDataType dty)

{
  undefined8 __s;
  size_t sVar1;
  ostream *poVar2;
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tyRet;
  stringstream ss;
  undefined1 local_1d8 [32];
  char local_1b8;
  stringstream local_1b0 [16];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  GetCrateDataType_abi_cxx11_
            ((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&((anon_union_32_2_293c120a_for_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                   *)local_1d8)->m_value,(crate *)(ulong)(uint)dty.name,(uint)dty.name);
  __s = local_1d8._0_8_;
  if (local_1b8 == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"[Invalid]","");
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1b0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"CrateDataType: ",0xf)
    ;
    if ((char *)__s == (char *)0x0) {
      ::std::ios::clear((int)(ostream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
    }
    else {
      sVar1 = strlen((char *)__s);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)__s,sVar1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"(",1);
    poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"), supports_array = ",0x14);
    ::std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b0);
    ::std::ios_base::~ios_base(local_130);
  }
  if ((local_1b8 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ !=
      &(((anon_union_32_2_293c120a_for_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
          *)local_1d8)->m_error).field_2)) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetCrateDataTypeRepr(CrateDataType dty) {
  auto tyRet = GetCrateDataType(static_cast<int32_t>(dty.dtype_id));
  if (!tyRet) {
    return "[Invalid]";
  }

  const CrateDataType ty = tyRet.value();

  std::stringstream ss;
  ss << "CrateDataType: " << ty.name << "("
     << static_cast<uint32_t>(ty.dtype_id)
     << "), supports_array = " << ty.supports_array;
  return ss.str();
}